

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::make_constant_null(Compiler *this,uint32_t id,uint32_t type)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  SPIRType *constant_type_;
  SPIRConstant *pSVar5;
  bool *pbVar6;
  uint *puVar7;
  size_t sVar8;
  ulong uVar9;
  TypedID *this_00;
  uint local_108;
  SPIRConstant *constant_2;
  uint *local_e8;
  uint local_dc;
  undefined1 local_d8 [4];
  uint32_t i_1;
  SmallVector<unsigned_int,_8UL> elements_1;
  uint32_t member_ids;
  bool local_8d;
  uint local_8c;
  uint *local_88;
  SPIRConstant *local_80;
  SPIRConstant *constant_1;
  undefined1 local_70 [4];
  uint32_t i;
  SmallVector<unsigned_int,_8UL> elements;
  uint32_t count;
  bool is_literal_array_size;
  uint32_t parent_id;
  SPIRConstant *constant;
  SPIRType *constant_type;
  uint32_t type_local;
  uint32_t id_local;
  Compiler *this_local;
  
  constant_type._0_4_ = type;
  constant_type._4_4_ = id;
  _type_local = this;
  constant_type_ = get<diligent_spirv_cross::SPIRType>(this,type);
  if ((constant_type_->pointer & 1U) == 0) {
    bVar1 = VectorView<unsigned_int>::empty(&(constant_type_->array).super_VectorView<unsigned_int>)
    ;
    if (bVar1) {
      bVar1 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::empty
                        (&(constant_type_->member_types).
                          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                        );
      if (bVar1) {
        pSVar5 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&>
                           (this,constant_type._4_4_,(uint *)&constant_type);
        SPIRConstant::make_null(pSVar5,constant_type_);
      }
      else {
        sVar8 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                          (&(constant_type_->member_types).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          );
        elements_1.stack_storage.aligned_char._24_4_ =
             ParsedIR::increase_bound_by(&this->ir,(uint32_t)sVar8);
        sVar8 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                          (&(constant_type_->member_types).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          );
        SmallVector<unsigned_int,_8UL>::SmallVector
                  ((SmallVector<unsigned_int,_8UL> *)local_d8,sVar8);
        for (local_dc = 0; uVar9 = (ulong)local_dc,
            sVar8 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                              (&(constant_type_->member_types).
                                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                              ), uVar2 = constant_type._4_4_, uVar9 < sVar8; local_dc = local_dc + 1
            ) {
          uVar2 = elements_1.stack_storage.aligned_char._24_4_ + local_dc;
          this_00 = (TypedID *)
                    VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::
                    operator[](&(constant_type_->member_types).
                                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                               ,(ulong)local_dc);
          uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
          make_constant_null(this,uVar2,uVar3);
          uVar4 = elements_1.stack_storage.aligned_char._24_4_ + local_dc;
          puVar7 = VectorView<unsigned_int>::operator[]
                             ((VectorView<unsigned_int> *)local_d8,(ulong)local_dc);
          *puVar7 = uVar4;
        }
        local_e8 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_d8);
        sVar8 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_d8);
        constant_2._4_4_ = (undefined4)sVar8;
        constant_2._3_1_ = 0;
        set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                  (this,uVar2,(uint *)&constant_type,&local_e8,(uint *)((long)&constant_2 + 4),
                   (bool *)((long)&constant_2 + 3));
        SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_d8);
      }
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&constant_type_->parent_type);
      if (uVar2 == 0) {
        __assert_fail("constant_type.parent_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                      ,0x132e,
                      "void diligent_spirv_cross::Compiler::make_constant_null(uint32_t, uint32_t)")
        ;
      }
      uVar2 = ParsedIR::increase_bound_by(&this->ir,1);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&constant_type_->parent_type);
      make_constant_null(this,uVar2,uVar3);
      pbVar6 = VectorView<bool>::back(&(constant_type_->array_size_literal).super_VectorView<bool>);
      bVar1 = *pbVar6;
      if ((bVar1 & 1U) == 0) {
        local_108 = 1;
      }
      else {
        puVar7 = VectorView<unsigned_int>::back
                           (&(constant_type_->array).super_VectorView<unsigned_int>);
        local_108 = *puVar7;
      }
      elements.stack_storage.aligned_char[0x1c] = (undefined1)local_108;
      elements.stack_storage.aligned_char[0x1d] = local_108._1_1_;
      elements.stack_storage.aligned_char[0x1e] = local_108._2_1_;
      elements.stack_storage.aligned_char[0x1f] = local_108._3_1_;
      SmallVector<unsigned_int,_8UL>::SmallVector
                ((SmallVector<unsigned_int,_8UL> *)local_70,(ulong)local_108);
      for (constant_1._4_4_ = 0; uVar3 = constant_type._4_4_,
          constant_1._4_4_ < (uint)elements.stack_storage.aligned_char._28_4_;
          constant_1._4_4_ = constant_1._4_4_ + 1) {
        puVar7 = VectorView<unsigned_int>::operator[]
                           ((VectorView<unsigned_int> *)local_70,(ulong)constant_1._4_4_);
        *puVar7 = uVar2;
      }
      local_88 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_70);
      sVar8 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_70);
      local_8c = (uint)sVar8;
      local_8d = false;
      local_80 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                           (this,uVar3,(uint *)&constant_type,&local_88,&local_8c,&local_8d);
      local_80->is_null_array_specialized_length = (bool)((bVar1 & 1U ^ 0xff) & 1);
      SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_70);
    }
  }
  else {
    pSVar5 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&>
                       (this,constant_type._4_4_,(uint *)&constant_type);
    SPIRConstant::make_null(pSVar5,constant_type_);
  }
  return;
}

Assistant:

void Compiler::make_constant_null(uint32_t id, uint32_t type)
{
	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		auto &constant = set<SPIRConstant>(id, type);
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = ir.increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type);

		// The array size of OpConstantNull can be either literal or specialization constant.
		// In the latter case, we cannot take the value as-is, as it can be changed to anything.
		// Rather, we assume it to be *one* for the sake of initializer.
		bool is_literal_array_size = constant_type.array_size_literal.back();
		uint32_t count = is_literal_array_size ? constant_type.array.back() : 1;
		SmallVector<uint32_t> elements(count);
		for (uint32_t i = 0; i < count; i++)
			elements[i] = parent_id;
		auto &constant = set<SPIRConstant>(id, type, elements.data(), uint32_t(elements.size()), false);
		constant.is_null_array_specialized_length = !is_literal_array_size;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = ir.increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i]);
			elements[i] = member_ids + i;
		}
		set<SPIRConstant>(id, type, elements.data(), uint32_t(elements.size()), false);
	}
	else
	{
		auto &constant = set<SPIRConstant>(id, type);
		constant.make_null(constant_type);
	}
}